

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceTests.cpp
# Opt level: O1

void setupMultiArrayFeature(FeatureDescription *feature,string *name)

{
  RepeatedField<long> *this;
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  FeatureType *pFVar4;
  ArrayFeatureType *pAVar5;
  long *plVar6;
  undefined8 *puVar7;
  Arena *pAVar8;
  
  uVar3 = (feature->super_MessageLite)._internal_metadata_.ptr_;
  puVar7 = (undefined8 *)(uVar3 & 0xfffffffffffffffc);
  if ((uVar3 & 1) != 0) {
    puVar7 = (undefined8 *)*puVar7;
  }
  google::protobuf::internal::ArenaStringPtr::Set(&feature->name_,name,puVar7);
  if (feature->type_ == (FeatureType *)0x0) {
    uVar3 = (feature->super_MessageLite)._internal_metadata_.ptr_;
    pAVar8 = (Arena *)(uVar3 & 0xfffffffffffffffc);
    if ((uVar3 & 1) != 0) {
      pAVar8 = *(Arena **)pAVar8;
    }
    pFVar4 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>(pAVar8)
    ;
    feature->type_ = pFVar4;
  }
  pFVar4 = feature->type_;
  if (pFVar4->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar4);
    pFVar4->_oneof_case_[0] = 5;
    uVar3 = (pFVar4->super_MessageLite)._internal_metadata_.ptr_;
    pAVar8 = (Arena *)(uVar3 & 0xfffffffffffffffc);
    if ((uVar3 & 1) != 0) {
      pAVar8 = *(Arena **)pAVar8;
    }
    pAVar5 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar8);
    (pFVar4->Type_).multiarraytype_ = pAVar5;
  }
  ((pFVar4->Type_).multiarraytype_)->datatype_ = 0x10020;
  if (feature->type_ == (FeatureType *)0x0) {
    uVar3 = (feature->super_MessageLite)._internal_metadata_.ptr_;
    pAVar8 = (Arena *)(uVar3 & 0xfffffffffffffffc);
    if ((uVar3 & 1) != 0) {
      pAVar8 = *(Arena **)pAVar8;
    }
    pFVar4 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>(pAVar8)
    ;
    feature->type_ = pFVar4;
  }
  pFVar4 = feature->type_;
  if (pFVar4->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar4);
    pFVar4->_oneof_case_[0] = 5;
    uVar3 = (pFVar4->super_MessageLite)._internal_metadata_.ptr_;
    pAVar8 = (Arena *)(uVar3 & 0xfffffffffffffffc);
    if ((uVar3 & 1) != 0) {
      pAVar8 = *(Arena **)pAVar8;
    }
    pAVar5 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar8);
    (pFVar4->Type_).multiarraytype_ = pAVar5;
  }
  pAVar5 = (pFVar4->Type_).multiarraytype_;
  this = &pAVar5->shape_;
  uVar1 = (pAVar5->shape_).current_size_;
  uVar2 = (pAVar5->shape_).total_size_;
  if (uVar1 == uVar2) {
    google::protobuf::RepeatedField<long>::Reserve(this,uVar2 + 1);
  }
  plVar6 = google::protobuf::RepeatedField<long>::elements(this);
  plVar6[uVar1] = 1;
  this->current_size_ = uVar1 + 1;
  return;
}

Assistant:

static void setupMultiArrayFeature(Specification::FeatureDescription *feature, const std::string& name) {
    feature->set_name(name);
    feature->mutable_type()->mutable_multiarraytype()->set_datatype(::CoreML::Specification::ArrayFeatureType_ArrayDataType_FLOAT32);
    feature->mutable_type()->mutable_multiarraytype()->add_shape(1);
}